

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::anon_unknown_1::FixedFunctionOOB::~FixedFunctionOOB(FixedFunctionOOB *this)

{
  ~FixedFunctionOOB(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

FixedFunctionOOB::~FixedFunctionOOB (void)
{
	try
	{
		// Reset GL_CONTEXT_LOST error before destroying resources
		m_gl.getGraphicsResetStatus();
		teardown();
	}
	catch (...)
	{
		// Ignore GL errors from teardown()
	}
}